

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O3

Fl_Menu_Item * __thiscall Fl_Menu_Item::find_shortcut(Fl_Menu_Item *this,int *ip,bool require_alt)

{
  int iVar1;
  int iVar2;
  
  if (this->text != (char *)0x0) {
    iVar2 = 0;
    do {
      if (((this->flags & 1) == 0) &&
         ((iVar1 = Fl::test_shortcut(this->shortcut_), iVar1 != 0 ||
          (iVar1 = Fl_Widget::test_shortcut(this->text,require_alt), iVar1 != 0)))) {
        if (ip != (int *)0x0) {
          *ip = iVar2;
          return this;
        }
        return this;
      }
      iVar1 = 0;
      do {
        if (this->text == (char *)0x0) {
          if (iVar1 == 0) {
            return (Fl_Menu_Item *)0x0;
          }
          iVar1 = iVar1 + -1;
        }
        else {
          iVar1 = iVar1 + (uint)(((uint)this->flags >> 6 & 1) != 0);
        }
        this = this + 1;
      } while (iVar1 != 0);
      iVar2 = iVar2 + 1;
    } while (this->text != (char *)0x0);
  }
  return (Fl_Menu_Item *)0x0;
}

Assistant:

const Fl_Menu_Item* Fl_Menu_Item::find_shortcut(int* ip, const bool require_alt) const {
  const Fl_Menu_Item* m = this;
  if (m) for (int ii = 0; m->text; m = next_visible_or_not(m), ii++) {
    if (m->active()) {
      if (Fl::test_shortcut(m->shortcut_)
	 || Fl_Widget::test_shortcut(m->text, require_alt)) {
	if (ip) *ip=ii;
	return m;
      }
    }
  }
  return 0;
}